

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O0

void __thiscall
sglr::GLContext::copyTexSubImage1D
          (GLContext *this,deUint32 target,int level,int xoffset,int x,int y,int width)

{
  code *pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  MessageBuilder *pMVar6;
  undefined4 extraout_var;
  int *piVar7;
  Enum<int,_2UL> EVar8;
  undefined1 local_1e0 [8];
  IVec2 offset;
  Enum<int,_2UL> local_1c8 [2];
  MessageBuilder local_1a8;
  int local_24;
  int local_20;
  int y_local;
  int x_local;
  int xoffset_local;
  int level_local;
  deUint32 target_local;
  GLContext *this_local;
  
  local_24 = y;
  local_20 = x;
  y_local = xoffset;
  x_local = level;
  xoffset_local = target;
  _level_local = this;
  if ((this->m_logFlags & 1) != 0) {
    tcu::TestLog::operator<<(&local_1a8,this->m_log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<(&local_1a8,(char (*) [21])"glCopyTexSubImage1D(");
    EVar8 = glu::getTextureTargetStr(xoffset_local);
    offset.m_data = (int  [2])EVar8.m_getName;
    local_1c8[0].m_value = EVar8.m_value;
    local_1c8[0].m_getName = (GetNameFunc)offset.m_data;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,local_1c8);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a3caab);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&x_local);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a3caab);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&y_local);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a3caab);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_20);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a3caab);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_24);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a3caab);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&width);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2a85ff4);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a8);
  }
  getReadOffset((GLContext *)local_1e0);
  iVar5 = (*this->m_context->_vptr_RenderContext[3])();
  iVar4 = xoffset_local;
  iVar3 = x_local;
  iVar2 = y_local;
  pcVar1 = *(code **)(CONCAT44(extraout_var,iVar5) + 0x358);
  piVar7 = tcu::Vector<int,_2>::x((Vector<int,_2> *)local_1e0);
  iVar5 = *piVar7 + local_20;
  piVar7 = tcu::Vector<int,_2>::y((Vector<int,_2> *)local_1e0);
  (*pcVar1)(iVar4,iVar3,iVar2,iVar5,*piVar7 + local_24,width);
  return;
}

Assistant:

void GLContext::copyTexSubImage1D (deUint32 target, int level, int xoffset, int x, int y, int width)
{
	if ((m_logFlags & GLCONTEXT_LOG_CALLS) != 0)
		m_log << TestLog::Message << "glCopyTexSubImage1D("
								  << glu::getTextureTargetStr(target) << ", "
								  << level << ", "
								  << xoffset << ", "
								  << x << ", " << y << ", "
								  << width << ")"
			  << TestLog::EndMessage;

	tcu::IVec2 offset = getReadOffset();
	m_context.getFunctions().copyTexSubImage1D(target, level, xoffset, offset.x()+x, offset.y()+y, width);
}